

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 name_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  cmake *pcVar4;
  cmState *pcVar5;
  string *in_name;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  char *local_190;
  char *cvars;
  string pathString;
  string local_150;
  undefined1 local_130 [8];
  string cnameString;
  string changeVars;
  string *cname;
  pointer pbStack_e0;
  pointer local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  string path;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string langComp;
  bool optional_local;
  cmMakefile *mf_local;
  string *lang_local;
  cmGlobalGenerator *this_local;
  
  langComp.field_2._M_local_buf[0xf] = optional;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"CMAKE_",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::operator+=((string *)local_48,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_48,"_COMPILER");
  pcVar2 = cmMakefile::GetDefinition(mf,(string *)local_48);
  if (pcVar2 == (char *)0x0) {
    if ((langComp.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     " not set, after EnableLanguage");
      cmSystemTools::Error(&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  else {
    path.field_2._8_8_ = cmMakefile::GetRequiredDefinition(mf,(string *)local_48);
    std::__cxx11::string::string((string *)local_b0);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)path.field_2._8_8_);
    name_00 = path.field_2._8_8_;
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_b0,(string *)path.field_2._8_8_);
    }
    else {
      cname = (string *)0x0;
      pbStack_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cname);
      cmsys::SystemTools::FindProgram
                (&local_d0,(string *)name_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cname,false);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cname);
    }
    if (((langComp.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0 &&
        (bVar1 = cmsys::SystemTools::FileExists((string *)local_b0), bVar1)))) {
      pcVar4 = GetCMakeInstance(this);
      pcVar5 = cmake::GetState(pcVar4);
      in_name = cmState::GetInitializedCacheValue(pcVar5,(string *)local_48);
      std::__cxx11::string::string((string *)(cnameString.field_2._M_local_buf + 8));
      if ((in_name != (string *)0x0) && ((langComp.field_2._M_local_buf[0xf] & 1U) == 0)) {
        std::__cxx11::string::string((string *)local_130);
        bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_130,(string *)in_name);
        }
        else {
          pathString.field_2._8_8_ = 0;
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(this_00);
          cmsys::SystemTools::FindProgram(&local_150,in_name,this_00,false);
          std::__cxx11::string::operator=((string *)local_130,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8));
        }
        std::__cxx11::string::string((string *)&cvars,(string *)local_b0);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_130);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&cvars);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_130,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cvars);
        if (bVar1) {
          pcVar4 = GetCMakeInstance(this);
          pcVar5 = cmake::GetState(pcVar4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_1b1);
          pcVar2 = cmState::GetGlobalProperty(pcVar5,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator(&local_1b1);
          local_190 = pcVar2;
          if (pcVar2 != (char *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)(cnameString.field_2._M_local_buf + 8),pcVar2);
            std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          }
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)local_48);
          std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)in_name);
          pcVar4 = GetCMakeInstance(this);
          pcVar5 = cmake::GetState(pcVar4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_1d9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          cmState::SetGlobalProperty(pcVar5,&local_1d8,pcVar2);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
        }
        std::__cxx11::string::~string((string *)&cvars);
        std::__cxx11::string::~string((string *)local_130);
      }
      std::__cxx11::string::~string((string *)(cnameString.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  const std::string* cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}